

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::GetGeomPrimvar
               (Stage *stage,GPrim *gprim,string *varname,GeomPrimvar *out_primvar,string *err)

{
  Attribute *pAVar1;
  AttrMetas *this;
  bool bVar2;
  int n;
  uint32_t uVar3;
  const_iterator cVar4;
  value_type *pvVar5;
  value_type_conflict4 *pvVar6;
  ostream *poVar7;
  pointer args;
  char *pcVar8;
  TimeSamples *ts;
  _Rb_tree_header *p_Var9;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  vector<int,_std::allocator<int>_> indices;
  vector<int,_std::allocator<int>_> indices_1;
  string index_name;
  string primvar_name;
  ostringstream ss_e_4;
  Attribute terminal_attr;
  GeomPrimvar primvar;
  allocator local_849;
  string local_848;
  GeomPrimvar *local_820;
  _Vector_base<int,_std::allocator<int>_> local_818;
  string local_7f8;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  string local_778 [12];
  undefined1 local_5f8 [104];
  undefined1 local_590 [576];
  GeomPrimvar local_350;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
    poVar7 = ::std::operator<<((ostream *)&local_350,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa2d);
    ::std::operator<<(poVar7," ");
    pcVar8 = "Output GeomPrimvar is nullptr.";
LAB_003baf38:
    poVar7 = ::std::operator<<((ostream *)&local_350,pcVar8);
    ::std::operator<<(poVar7,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_350);
    return false;
  }
  if (gprim == (GPrim *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
    poVar7 = ::std::operator<<((ostream *)&local_350,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa31);
    ::std::operator<<(poVar7," ");
    pcVar8 = "Input `gprim` arg is nullptr.";
    goto LAB_003baf38;
  }
  local_820 = out_primvar;
  GeomPrimvar::GeomPrimvar(&local_350);
  ::std::operator+(&local_798,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)varname);
  cVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(gprim->props)._M_t,(key_type *)&local_798);
  p_Var9 = &(gprim->props)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var9) {
    if (*(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4) < 2) {
      pAVar1 = (Attribute *)(cVar4._M_node + 2);
      bVar2 = Attribute::is_connection(pAVar1);
      if (bVar2) {
        Attribute::Attribute((Attribute *)local_5f8);
        out_primvar = (GeomPrimvar *)local_5f8;
        bVar2 = GetTerminalAttribute(stage,pAVar1,(string *)&local_798,(Attribute *)out_primvar,err)
        ;
        if (!bVar2) {
          Attribute::~Attribute((Attribute *)local_5f8);
          goto LAB_003bb0ac;
        }
        GeomPrimvar::set_value(&local_350,(Attribute *)local_5f8);
        Attribute::~Attribute((Attribute *)local_5f8);
      }
      else {
        GeomPrimvar::set_value(&local_350,pAVar1);
      }
      ::std::__cxx11::string::_M_assign((string *)&local_350);
      this = (AttrMetas *)(cVar4._M_node + 7);
      if ((char)cVar4._M_node[7]._M_color == _S_black) {
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                           ((optional<tinyusdz::Interpolation> *)this);
        GeomPrimvar::set_interpolation(&local_350,*pvVar5);
      }
      if (*(char *)&cVar4._M_node[7]._M_parent == '\x01') {
        pvVar6 = nonstd::optional_lite::optional<unsigned_int>::value
                           ((optional<unsigned_int> *)&cVar4._M_node[7]._M_parent);
        GeomPrimvar::set_elementSize(&local_350,*pvVar6);
      }
      bVar2 = AttrMetas::has_unauthoredValuesIndex(this);
      if (bVar2) {
        n = AttrMetas::get_unauthoredValuesIndex(this);
        GeomPrimvar::set_unauthoredValuesIndex(&local_350,n);
      }
      ::std::operator+(&local_7b8,&local_798,":indices");
      cVar4 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::find(&(gprim->props)._M_t,(key_type *)&local_7b8);
      if (((_Rb_tree_header *)cVar4._M_node == p_Var9) ||
         (1 < *(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4))) {
LAB_003bbb0a:
        GeomPrimvar::operator=(local_820,&local_350);
        bVar2 = true;
      }
      else {
        uVar3 = Attribute::type_id(&local_350._attr);
        if ((uVar3 >> 0x14 & 1) == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
          poVar7 = ::std::operator<<((ostream *)local_5f8,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa76);
          ::std::operator<<(poVar7," ");
          ::std::__cxx11::string::string
                    ((string *)&local_848,
                     "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
                     ,(allocator *)&local_7d8);
          fmt::format<std::__cxx11::string>
                    (local_778,(fmt *)&local_848,&local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     out_primvar);
          poVar7 = ::std::operator<<((ostream *)local_5f8,(string *)local_778);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
LAB_003bb27e:
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
        }
        else {
          pAVar1 = (Attribute *)(cVar4._M_node + 2);
          bVar2 = Attribute::is_connection(pAVar1);
          if (!bVar2) {
            bVar2 = Attribute::is_blocked(pAVar1);
            if (!bVar2) {
              bVar2 = tinyusdz::primvar::PrimVar::has_value((PrimVar *)&cVar4._M_node[4]._M_parent);
              if ((!bVar2) && (cVar4._M_node[5]._M_left == cVar4._M_node[5]._M_parent)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
                poVar7 = ::std::operator<<((ostream *)local_5f8,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xaa6);
                ::std::operator<<(poVar7," ");
                poVar7 = ::std::operator<<((ostream *)local_5f8,
                                           "[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value."
                                          );
                ::std::operator<<(poVar7,"\n");
                goto LAB_003bb27e;
              }
              bVar2 = tinyusdz::primvar::PrimVar::has_value((PrimVar *)&cVar4._M_node[4]._M_parent);
              if (bVar2) {
                local_7f8._M_dataplus._M_p = (pointer)0x0;
                local_7f8._M_string_length = 0;
                local_7f8.field_2._M_allocated_capacity = 0;
                bVar2 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                  (pAVar1,(vector<int,_std::allocator<int>_> *)&local_7f8);
                if (bVar2) {
                  ::std::vector<int,_std::allocator<int>_>::operator=
                            (&local_350._indices,(vector<int,_std::allocator<int>_> *)&local_7f8);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
                  poVar7 = ::std::operator<<((ostream *)local_5f8,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xab0);
                  ::std::operator<<(poVar7," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_848,"Index Attribute is not int[] type. Got {}",
                             (allocator *)&local_818);
                  Attribute::type_name_abi_cxx11_((string *)&local_7d8,pAVar1);
                  fmt::format<std::__cxx11::string>
                            (local_778,(fmt *)&local_848,&local_7d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             out_primvar);
                  poVar7 = ::std::operator<<((ostream *)local_5f8,(string *)local_778);
                  ::std::operator<<(poVar7,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
                }
                ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&local_7f8);
                if (!bVar2) goto LAB_003bbb2d;
              }
              if (cVar4._M_node[5]._M_left != cVar4._M_node[5]._M_parent) {
                local_778[0].field_2._M_local_buf[0] = '\0';
                local_778[0].field_2._1_8_ = 0;
                local_778[0]._M_dataplus._M_p = (pointer)0x0;
                local_778[0]._M_string_length._0_1_ = 0;
                local_778[0]._M_string_length._1_7_ = 0;
                bVar2 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                  ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                   local_778,(TimeSamples *)&cVar4._M_node[5]._M_parent);
                if (bVar2) {
                  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::operator=
                            (&local_350._ts_indices,
                             (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_778)
                  ;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
                  poVar7 = ::std::operator<<((ostream *)local_5f8,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xabb);
                  ::std::operator<<(poVar7," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_7d8,
                             "Index Attribute seems not an timesamples with int[] type: {}",
                             (allocator *)&local_7f8);
                  fmt::format<std::__cxx11::string>
                            (&local_848,(fmt *)&local_7d8,&local_7b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             out_primvar);
                  poVar7 = ::std::operator<<((ostream *)local_5f8,(string *)&local_848);
                  ::std::operator<<(poVar7,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
                }
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                           *)local_778);
                if (!bVar2) goto LAB_003bbb2d;
              }
            }
            goto LAB_003bbb0a;
          }
          Attribute::Attribute((Attribute *)local_5f8);
          bVar2 = GetTerminalAttribute(stage,pAVar1,(string *)&local_7b8,(Attribute *)local_5f8,err)
          ;
          if (bVar2) {
            bVar2 = tinyusdz::primvar::PrimVar::has_value((PrimVar *)(local_5f8 + 0x48));
            if ((bVar2) || (local_590._8_8_ != local_590._0_8_)) {
              args = (pointer)local_590._8_8_;
              if (local_590._8_8_ != local_590._0_8_) {
                local_848.field_2._M_local_buf[0] = '\0';
                local_848.field_2._1_8_ = 0;
                local_848._M_dataplus._M_p = (pointer)0x0;
                local_848._M_string_length._0_1_ = 0;
                local_848._M_string_length._1_7_ = 0;
                bVar2 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                  ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                   &local_848,(TimeSamples *)local_590);
                if (bVar2) {
                  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::operator=
                            (&local_350._ts_indices,
                             (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)&local_848
                            );
                  args = (pointer)local_590._8_8_;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_778);
                  poVar7 = ::std::operator<<((ostream *)local_778,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa8c);
                  ::std::operator<<(poVar7," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_7f8,
                             "Index Attribute seems not an timesamples with int[] type: {}",
                             (allocator *)&local_818);
                  fmt::format<std::__cxx11::string>
                            (&local_7d8,(fmt *)&local_7f8,&local_7b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_590._8_8_);
                  poVar7 = ::std::operator<<((ostream *)local_778,(string *)&local_7d8);
                  ::std::operator<<(poVar7,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  args = (pointer)local_590._8_8_;
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                    args = (pointer)local_590._8_8_;
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_778);
                }
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                           *)&local_848);
                if (!bVar2) goto LAB_003bbb20;
              }
              bVar2 = tinyusdz::primvar::PrimVar::has_value((PrimVar *)(local_5f8 + 0x48));
              if (bVar2) {
                local_818._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_818._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_818._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar2 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                  ((Attribute *)local_5f8,
                                   (vector<int,_std::allocator<int>_> *)&local_818);
                if (bVar2) {
                  ::std::vector<int,_std::allocator<int>_>::operator=
                            (&local_350._indices,(vector<int,_std::allocator<int>_> *)&local_818);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_778);
                  poVar7 = ::std::operator<<((ostream *)local_778,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa99);
                  ::std::operator<<(poVar7," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_7d8,"Index Attribute is not int[] type. Got {}",
                             &local_849);
                  Attribute::type_name_abi_cxx11_(&local_7f8,pAVar1);
                  fmt::format<std::__cxx11::string>
                            (&local_848,(fmt *)&local_7d8,(string *)&local_7f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  poVar7 = ::std::operator<<((ostream *)local_778,(string *)&local_848);
                  ::std::operator<<(poVar7,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::append((string *)err);
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_778);
                }
                ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_818);
                if (!bVar2) goto LAB_003bbb20;
              }
              Attribute::~Attribute((Attribute *)local_5f8);
              goto LAB_003bbb0a;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_778);
            poVar7 = ::std::operator<<((ostream *)local_778,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa83);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_778,
                                       "[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value."
                                      );
            ::std::operator<<(poVar7,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_778);
          }
LAB_003bbb20:
          Attribute::~Attribute((Attribute *)local_5f8);
        }
LAB_003bbb2d:
        bVar2 = false;
      }
      ::std::__cxx11::string::_M_dispose();
      goto LAB_003bbb3c;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    poVar7 = ::std::operator<<((ostream *)local_5f8,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"GetGeomPrimvar");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa67);
    ::std::operator<<(poVar7," ");
    ::std::__cxx11::string::string
              ((string *)&local_7b8,"{} is not Attribute(Maybe Relationship?).",
               (allocator *)&local_848);
    fmt::format<std::__cxx11::string>
              (local_778,(fmt *)&local_7b8,&local_798,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out_primvar);
    poVar7 = ::std::operator<<((ostream *)local_5f8,(string *)local_778);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  }
LAB_003bb0ac:
  bVar2 = false;
LAB_003bbb3c:
  ::std::__cxx11::string::_M_dispose();
  GeomPrimvar::~GeomPrimvar(&local_350);
  return bVar2;
}

Assistant:

bool GetGeomPrimvar(const Stage &stage, const GPrim *gprim,
                    const std::string &varname, GeomPrimvar *out_primvar,
                    std::string *err) {
  if (!out_primvar) {
    PUSH_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  if (!gprim) {
    PUSH_ERROR_AND_RETURN("Input `gprim` arg is nullptr.");
  }

  GeomPrimvar primvar;

  constexpr auto kPrimvars = "primvars:";
  constexpr auto kIndices = ":indices";

  std::string primvar_name = kPrimvars + varname;

  const auto it = gprim->props.find(primvar_name);
  if (it == gprim->props.end()) {
    return false;
  }

  // The order of Attribute value evaluation:
  // - default or timesamples
  // - connection


  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    if (attr.is_connection()) { // attribute only contains 'connection'
      // follow targetPath to get Attribute 
      Attribute terminal_attr;
      bool ret = tydra::GetTerminalAttribute(stage, attr, primvar_name,
                                             &terminal_attr, err);
      if (!ret) {
        return false;
      }

      primvar.set_value(terminal_attr);

    } else {
      // default, timeSamples
      primvar.set_value(attr);
    }

    primvar.set_name(varname);

    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }
    // TODO: copy other attribute metas?

  } else {
    PUSH_ERROR_AND_RETURN(
        fmt::format("{} is not Attribute(Maybe Relationship?).", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = gprim->props.find(index_name);

  if (indexIt != gprim->props.end()) {
    if (indexIt->second.is_attribute()) {
      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is "
                        "not supported. PrimVar name: {}",
                        primvar_name));
      }

      if (indexAttr.is_connection()) { // attribute only contains 'connection'
        // follow targetPath to get Attribute 
        Attribute terminal_indexAttr;
        bool ret = tydra::GetTerminalAttribute(stage, indexAttr, index_name,
                                               &terminal_indexAttr, err);
        if (!ret) {
          return false;
        }

        if (!terminal_indexAttr.has_value() && !terminal_indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value.");
        }

        if (terminal_indexAttr.has_timesamples()) {
          const auto &ts = terminal_indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format(
                "Index Attribute seems not an timesamples with int[] type: {}",
                index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

        if (terminal_indexAttr.has_value()) {

          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!terminal_indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);

        }
      
      } else if (indexAttr.is_blocked()) {
        // Value blocked. e.g. `float2[] primvars:st:indices = None`
        // We can simply skip reading indices.
      } else {

        if (!indexAttr.has_value() && !indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value.");
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }


          primvar.set_default_indices(indices);
        }

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}